

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TString * str_checkname(LexState *ls)

{
  TString *pTVar1;
  SemInfo SVar2;
  undefined4 uVar3;
  int iVar4;
  Token *pTVar5;
  
  if ((ls->t).token == 0x11d) {
    pTVar1 = (TString *)(ls->t).seminfo.r;
    ls->lastline = ls->linenumber;
    if ((ls->lookahead).token == 0x11f) {
      iVar4 = llex(ls,&(ls->t).seminfo);
      (ls->t).token = iVar4;
    }
    else {
      pTVar5 = &ls->lookahead;
      uVar3 = *(undefined4 *)&pTVar5->field_0x4;
      SVar2 = (ls->lookahead).seminfo;
      (ls->t).token = pTVar5->token;
      *(undefined4 *)&(ls->t).field_0x4 = uVar3;
      (ls->t).seminfo = SVar2;
      pTVar5->token = 0x11f;
    }
    return pTVar1;
  }
  error_expected(ls,0x11d);
}

Assistant:

static TString*str_checkname(LexState*ls){
TString*ts;
check(ls,TK_NAME);
ts=ls->t.seminfo.ts;
luaX_next(ls);
return ts;
}